

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall File::setText(File *this,string *text)

{
  u16string uStack_38;
  
  UtfHandler::utf8to16(&uStack_38,&this->utf,text);
  TextBuffer::set_text(&this->buffer,&uStack_38);
  std::__cxx11::u16string::~u16string((u16string *)&uStack_38);
  if (this->hasParser == true) {
    ts_tree_delete(this->tree);
    this->tree = (TSTree *)0x0;
    executeParse(this);
  }
  return;
}

Assistant:

void File::setText (std::string &&text) {
    buffer.set_text(utf.utf8to16(text));

    if (hasParser) {
        ts_tree_delete(tree);
        tree = nullptr;
        executeParse();
    }
}